

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O3

bool __thiscall llvm::Triple::isCompatibleWith(Triple *this,Triple *Other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ArchType AVar5;
  SubArchType SVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  AVar5 = this->Arch;
  if ((int)AVar5 < 0x1d) {
    if (AVar5 == arm) {
      if (Other->Arch != thumb) goto LAB_0013342c;
    }
    else if ((AVar5 != armeb) || (Other->Arch != thumbeb)) {
LAB_0013342c:
      if (this->Vendor != Apple) {
        auVar7[0] = -((char)Other->Arch == (char)this->Arch);
        auVar7[1] = -(*(byte *)((long)&Other->Arch + 1) == *(byte *)((long)&this->Arch + 1));
        auVar7[2] = -(*(byte *)((long)&Other->Arch + 2) == *(byte *)((long)&this->Arch + 2));
        auVar7[3] = -(*(byte *)((long)&Other->Arch + 3) == *(byte *)((long)&this->Arch + 3));
        auVar7[4] = -((char)Other->SubArch == (char)this->SubArch);
        auVar7[5] = -(*(byte *)((long)&Other->SubArch + 1) == *(byte *)((long)&this->SubArch + 1));
        auVar7[6] = -(*(byte *)((long)&Other->SubArch + 2) == *(byte *)((long)&this->SubArch + 2));
        auVar7[7] = -(*(byte *)((long)&Other->SubArch + 3) == *(byte *)((long)&this->SubArch + 3));
        auVar7[8] = -((char)Other->Vendor == (char)this->Vendor);
        auVar7[9] = -(*(byte *)((long)&Other->Vendor + 1) == *(byte *)((long)&this->Vendor + 1));
        auVar7[10] = -(*(byte *)((long)&Other->Vendor + 2) == *(byte *)((long)&this->Vendor + 2));
        auVar7[0xb] = -(*(byte *)((long)&Other->Vendor + 3) == *(byte *)((long)&this->Vendor + 3));
        auVar7[0xc] = -((char)Other->OS == (char)this->OS);
        auVar7[0xd] = -(*(byte *)((long)&Other->OS + 1) == *(byte *)((long)&this->OS + 1));
        auVar7[0xe] = -(*(byte *)((long)&Other->OS + 2) == *(byte *)((long)&this->OS + 2));
        auVar7[0xf] = -(*(byte *)((long)&Other->OS + 3) == *(byte *)((long)&this->OS + 3));
        uVar1 = this->Environment;
        uVar3 = this->ObjectFormat;
        uVar2 = Other->Environment;
        uVar4 = Other->ObjectFormat;
        auVar8[0] = -((char)uVar2 == (char)uVar1);
        auVar8[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
        auVar8[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
        auVar8[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
        auVar8[4] = -((char)uVar4 == (char)uVar3);
        auVar8[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
        auVar8[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
        auVar8[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
        auVar8[8] = 0xff;
        auVar8[9] = 0xff;
        auVar8[10] = 0xff;
        auVar8[0xb] = 0xff;
        auVar8[0xc] = 0xff;
        auVar8[0xd] = 0xff;
        auVar8[0xe] = 0xff;
        auVar8[0xf] = 0xff;
        auVar8 = auVar8 & auVar7;
        return (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff;
      }
      if (AVar5 != Other->Arch) {
        return false;
      }
      if (this->SubArch != Other->SubArch) {
        return false;
      }
      if (Other->Vendor != Apple) {
        return false;
      }
      goto LAB_0013344b;
    }
  }
  else if (AVar5 == thumbeb) {
    if (Other->Arch != armeb) goto LAB_0013342c;
  }
  else if ((AVar5 != thumb) || (Other->Arch != arm)) goto LAB_0013342c;
  SVar6 = this->SubArch ^ Other->SubArch;
  if (this->Vendor != Apple) {
    if (this->Vendor != Other->Vendor || SVar6 != NoSubArch) {
      return false;
    }
    if (this->OS == Other->OS) {
      if (this->Environment == Other->Environment) {
        return this->ObjectFormat == Other->ObjectFormat;
      }
      return false;
    }
    return false;
  }
  if (Other->Vendor != Apple || SVar6 != NoSubArch) {
    return false;
  }
LAB_0013344b:
  return this->OS == Other->OS;
}

Assistant:

SubArchType getSubArch() const { return SubArch; }